

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O2

Value<char> * __thiscall Qentem::Value<char>::operator[](Value<char> *this,SizeT index)

{
  uint uVar1;
  Value<char> *pVVar2;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_38;
  undefined1 local_28;
  
  if (this->type_ == Object) {
    pVVar2 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::GetValue
                       ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)this,index);
    if (pVVar2 != (Value<char> *)0x0) {
      return pVVar2;
    }
LAB_00119227:
    reset(this);
    this->type_ = Array;
    uVar1 = (this->field_0).array_.index_;
  }
  else {
    if (this->type_ != Array) goto LAB_00119227;
    uVar1 = (this->field_0).array_.index_;
    if (index < uVar1) goto LAB_0011926d;
  }
  if (uVar1 == index) {
    local_28 = 0;
    local_38.array_.storage_ = (Value<char> *)0x0;
    local_38._8_8_ = 0;
    Array<Qentem::Value<char>_>::operator+=
              ((Array<Qentem::Value<char>_> *)this,(Value<char> *)&local_38.array_);
    ~Value((Value<char> *)&local_38.array_);
  }
  else {
    Array<Qentem::Value<char>_>::ResizeAndInitialize((Array<Qentem::Value<char>_> *)this,index + 1);
  }
LAB_0011926d:
  return (this->field_0).array_.storage_ + index;
}

Assistant:

Value &operator[](SizeT index) {
        const ValueType type = Type();

        if (type == ValueType::Array) {
            if (array_.Size() > index) {
                return (array_.Storage()[index]);
            }
        } else {
            if (type == ValueType::Object) {
                Value *val = object_.GetValue(index);

                if (val != nullptr) {
                    return *val;
                }
            }

            reset();
            setTypeToArray();
        }

        if (array_.Size() == index) {
            array_ += Value{};
        } else {
            array_.ResizeAndInitialize(index + SizeT{1});
        }

        return (array_.Storage()[index]);
    }